

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgrenderstate.cpp
# Opt level: O3

void __thiscall lunasvg::SVGRenderState::beginGroup(SVGRenderState *this,SVGBlendInfo *blendInfo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Canvas *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Rect boundingBox;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  Rect local_38;
  
  bVar5 = SVGBlendInfo::requiresCompositing(blendInfo,this->m_mode);
  if (bVar5) {
    (*(this->m_element->super_SVGNode)._vptr_SVGNode[0xd])();
    local_38 = Transform::mapRect(&this->m_currentTransform,(Rect *)local_58);
    this_00 = (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar1 = this_00->m_x;
    uVar2 = this_00->m_y;
    local_58._16_8_ = CONCAT44((float)(int)uVar2,(float)(int)uVar1);
    uStack_40 = 0;
    iVar6 = Canvas::width(this_00);
    iVar7 = Canvas::height(this_00);
    local_58._8_8_ = CONCAT44((float)iVar7,(float)iVar6);
    local_58._0_8_ = local_58._16_8_;
    local_38 = Rect::intersected(&local_38,(Rect *)local_58);
    Canvas::create((Canvas *)local_58,&local_38);
    uVar4 = local_58._8_8_;
    uVar3 = local_58._0_8_;
    local_58._0_8_ = (plutovg_surface_t *)0x0;
    local_58._8_8_ = (plutovg_canvas_t *)0x0;
    this_01 = (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    (this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      if ((plutovg_canvas_t *)local_58._8_8_ != (plutovg_canvas_t *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
  }
  else {
    Canvas::save((this->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    if (blendInfo->m_clipper != (SVGClipPathElement *)0x0) {
      SVGClipPathElement::applyClipPath(blendInfo->m_clipper,this);
      return;
    }
  }
  return;
}

Assistant:

void SVGRenderState::beginGroup(const SVGBlendInfo& blendInfo)
{
    auto requiresCompositing = blendInfo.requiresCompositing(m_mode);
    if(requiresCompositing) {
        auto boundingBox = m_currentTransform.mapRect(m_element->paintBoundingBox());
        boundingBox.intersect(m_canvas->extents());
        m_canvas = Canvas::create(boundingBox);
    } else {
        m_canvas->save();
    }

    if(!requiresCompositing && blendInfo.clipper()) {
        blendInfo.clipper()->applyClipPath(*this);
    }
}